

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::torrent_checked_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,torrent_checked_alert *this)

{
  string local_38;
  torrent_checked_alert *local_18;
  torrent_checked_alert *this_local;
  
  local_18 = this;
  this_local = (torrent_checked_alert *)__return_storage_ptr__;
  torrent_alert::message_abi_cxx11_(&local_38,&this->super_torrent_alert);
  std::operator+(__return_storage_ptr__,&local_38," checked");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_checked_alert::message() const
	{
		return torrent_alert::message() + " checked";
	}